

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O0

void __thiscall
nigel::IMC_Generator::generateUnaryROperation
          (IMC_Generator *this,OperationType comb,HexOp op_acc,shared_ptr<nigel::IM_Operator> *op,
          shared_ptr<nigel::Token> *token)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  HexOp HVar3;
  bool bVar4;
  element_type *peVar5;
  shared_ptr<nigel::IM_Operator> local_288;
  shared_ptr<nigel::IM_Operator> local_278;
  shared_ptr<nigel::IM_Operator> local_268;
  shared_ptr<nigel::IM_Operator> local_258;
  shared_ptr<nigel::IM_Operator> local_248;
  shared_ptr<nigel::IM_Operator> local_238;
  shared_ptr<nigel::Token> local_228;
  shared_ptr<nigel::IM_Operator> local_218;
  shared_ptr<nigel::IM_Operator> local_208;
  shared_ptr<nigel::IM_Operator> local_1f8;
  shared_ptr<nigel::IM_Operator> local_1e8;
  shared_ptr<nigel::IM_Operator> local_1d8;
  shared_ptr<nigel::IM_Operator> local_1c8;
  shared_ptr<nigel::IM_Operator> local_1b8;
  IM_Operator local_1a8;
  shared_ptr<nigel::IM_SFR> local_188;
  shared_ptr<nigel::IM_Operator> local_178;
  shared_ptr<nigel::IM_Operator> local_168;
  shared_ptr<nigel::IM_Operator> local_158;
  shared_ptr<nigel::IM_Operator> local_148;
  shared_ptr<nigel::IM_Operator> local_138;
  shared_ptr<nigel::IM_Operator> local_128;
  shared_ptr<nigel::IM_SFR> local_118;
  shared_ptr<nigel::IM_Operator> local_108;
  shared_ptr<nigel::IM_Operator> local_f8;
  shared_ptr<nigel::IM_Operator> local_e8;
  shared_ptr<nigel::IM_Operator> local_d8;
  shared_ptr<nigel::IM_Operator> local_c8;
  IM_Operator local_b8;
  shared_ptr<nigel::IM_Operator> local_98;
  shared_ptr<nigel::IM_Operator> local_88;
  shared_ptr<nigel::IM_Operator> local_78 [2];
  shared_ptr<nigel::IM_Operator> local_58;
  shared_ptr<nigel::IM_Operator> local_48;
  undefined1 local_38 [24];
  shared_ptr<nigel::Token> *token_local;
  shared_ptr<nigel::IM_Operator> *op_local;
  HexOp op_acc_local;
  OperationType comb_local;
  IMC_Generator *this_local;
  
  local_38._16_8_ = token;
  token_local = (shared_ptr<nigel::Token> *)op;
  op_local._0_4_ = op_acc;
  op_local._4_4_ = comb;
  _op_acc_local = this;
  if (comb == v) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               op);
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_38);
    peVar5 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    iVar2 = *(int *)&(peVar5->super_IM_Operator).field_0x1c;
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)local_38);
    if (iVar2 == 0) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_48,op);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_58,(nullptr_t)0x0);
      addCmd(this,mov_a_adr,&local_48,&local_58);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_58);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_48);
      HVar3 = (HexOp)op_local;
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(local_78,(nullptr_t)0x0);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_88,(nullptr_t)0x0);
      addCmd(this,HVar3,local_78,&local_88);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_88);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(local_78);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_98,op);
      p_Var1 = &local_b8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
      addCmd(this,xch_a_adr,&local_98,(shared_ptr<nigel::IM_Operator> *)p_Var1);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)
                 &local_b8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_98);
    }
    else {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)op);
      IM_Operator::as<nigel::IM_Variable>(&local_b8);
      peVar5 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_b8);
      iVar2 = *(int *)&(peVar5->super_IM_Operator).field_0x1c;
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_b8);
      if (iVar2 == 1) {
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_c8,op);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_d8,(nullptr_t)0x0);
        addCmd(this,mov_dptr_const,&local_c8,&local_d8);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_d8);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_c8);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_e8,(nullptr_t)0x0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_f8,(nullptr_t)0x0);
        addCmd(this,movx_a_dptr,&local_e8,&local_f8);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_f8);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_e8);
        IM_SFR::getSFR((SFR)&local_118);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_108,&local_118);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_128,(nullptr_t)0x0);
        addCmd(this,mov_adr_a,&local_108,&local_128);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_128);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_108);
        std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_118);
        HVar3 = (HexOp)op_local;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_138,(nullptr_t)0x0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_148,(nullptr_t)0x0);
        addCmd(this,HVar3,&local_138,&local_148);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_148);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_138);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_158,(nullptr_t)0x0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_168,(nullptr_t)0x0);
        addCmd(this,movx_dptr_a,&local_158,&local_168);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_168);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_158);
        IM_SFR::getSFR((SFR)&local_188);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_178,&local_188);
        p_Var1 = &local_1a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
        addCmd(this,mov_a_adr,&local_178,(shared_ptr<nigel::IM_Operator> *)p_Var1);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)
                   &local_1a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_178);
        std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_188);
      }
      else {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)op);
        IM_Operator::as<nigel::IM_Variable>(&local_1a8);
        peVar5 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_1a8);
        bVar4 = IM_Variable::isOnStack(peVar5);
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                  ((shared_ptr<nigel::IM_Variable> *)&local_1a8);
        if (bVar4) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1b8,op);
          generateLoadStackR0(this,&local_1b8);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1b8);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1c8,(nullptr_t)0x0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1d8,(nullptr_t)0x0);
          addCmd(this,mov_a_atr0,&local_1c8,&local_1d8);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1d8);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1c8);
          HVar3 = (HexOp)op_local;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1e8,(nullptr_t)0x0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1f8,(nullptr_t)0x0);
          addCmd(this,HVar3,&local_1e8,&local_1f8);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1f8);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1e8);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_208,(nullptr_t)0x0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_218,(nullptr_t)0x0);
          addCmd(this,xch_a_atr0,&local_208,&local_218);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_218);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_208);
        }
      }
    }
  }
  else if (comb == c) {
    std::shared_ptr<nigel::Token>::shared_ptr(&local_228,token);
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,imp_operationOnConstantCanBePrevented,&local_228);
    std::shared_ptr<nigel::Token>::~shared_ptr(&local_228);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_238,op);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_248,(nullptr_t)0x0);
    addCmd(this,mov_a_const,&local_238,&local_248);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_248);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_238);
    HVar3 = (HexOp)op_local;
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_258,(nullptr_t)0x0);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_268,(nullptr_t)0x0);
    addCmd(this,HVar3,&local_258,&local_268);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_268);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_258);
  }
  else if (comb == t) {
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_278,(nullptr_t)0x0);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_288,(nullptr_t)0x0);
    addCmd(this,op_acc,&local_278,&local_288);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_288);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_278);
  }
  return;
}

Assistant:

void IMC_Generator::generateUnaryROperation( OperationType comb, HexOp op_acc, std::shared_ptr<IM_Operator> op, std::shared_ptr<Token> token )
	{
		if( comb == OT::v )
		{
			if( op->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, op );
				addCmd( op_acc );
				addCmd( HexOp::xch_a_adr, op );
			}
			else if( op->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, op );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( op_acc );
				addCmd( HexOp::movx_dptr_a );
				addCmd( HexOp::mov_a_adr, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( op->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( op );
				addCmd( HexOp::mov_a_atr0 );
				addCmd( op_acc );
				addCmd( HexOp::xch_a_atr0 );
			}
		}
		else if( comb == OT::c )
		{
			generateNotification( NT::imp_operationOnConstantCanBePrevented, token );
			addCmd( HexOp::mov_a_const, op );
			addCmd( op_acc );
		}
		else if( comb == OT::t )
		{
			addCmd( op_acc );
		}
	}